

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O2

ssize_t __thiscall
SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::read
          (ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,int __fd,
          void *__buf,size_t __nbytes)

{
  element_type *b;
  __uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  s;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  __shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  *p_Var1;
  string_view delim;
  type local_38;
  
  p_Var1 = (__shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
            *)CONCAT44(in_register_00000034,__fd);
  Connection::set_timeout
            ((p_Var1->_M_ptr->connection).
             super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0);
  b = (p_Var1->_M_ptr->response).
      super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr;
  s._M_t.
  super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  .super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_false>.
  _M_head_impl = (((p_Var1->_M_ptr->connection).
                   super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->socket)._M_t.
                 super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
                 ._M_t;
  local_38.this = this;
  std::
  __shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_38.session.
                  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
                 ,p_Var1);
  delim._M_str = "\r\n\r\n";
  delim._M_len = 4;
  asio::
  async_read_until<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>,std::allocator<char>,SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::read(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Session>const&)::_lambda(std::error_code_const&,unsigned_long)_1_>
            ((stream<asio::basic_stream_socket<asio::ip::tcp>_> *)
             s._M_t.
             super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
             .
             super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_*,_false>
             ._M_head_impl,&b->streambuf,delim,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.session.
              super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return extraout_RAX;
}

Assistant:

void read(const std::shared_ptr<Session> &session) {
      session->connection->set_timeout();
      asio::async_read_until(*session->connection->socket, session->response->streambuf, "\r\n\r\n", [this, session](const error_code &ec, std::size_t bytes_transferred) {
        session->connection->cancel_timeout();
        auto lock = session->connection->handler_runner->continue_lock();
        if(!lock)
          return;
        if((!ec || ec == asio::error::not_found) && session->response->streambuf.size() == session->response->streambuf.max_size()) {
          session->callback(session->connection, make_error_code::make_error_code(errc::message_size));
          return;
        }
        if(!ec) {
          session->connection->attempt_reconnect = true;
          std::size_t num_additional_bytes = session->response->streambuf.size() - bytes_transferred;

          if(!ResponseMessage::parse(session->response->content, session->response->http_version, session->response->status_code, session->response->header)) {
            session->callback(session->connection, make_error_code::make_error_code(errc::protocol_error));
            return;
          }

          auto header_it = session->response->header.find("Content-Length");
          if(header_it != session->response->header.end()) {
            auto content_length = stoull(header_it->second);
            if(content_length > num_additional_bytes) {
              session->connection->set_timeout();
              asio::async_read(*session->connection->socket, session->response->streambuf, asio::transfer_exactly(content_length - num_additional_bytes), [session](const error_code &ec, std::size_t /*bytes_transferred*/) {
                session->connection->cancel_timeout();
                auto lock = session->connection->handler_runner->continue_lock();
                if(!lock)
                  return;
                if(!ec) {
                  if(session->response->streambuf.size() == session->response->streambuf.max_size()) {
                    session->callback(session->connection, make_error_code::make_error_code(errc::message_size));
                    return;
                  }
                  session->callback(session->connection, ec);
                }
                else
                  session->callback(session->connection, ec);
              });
            }
            else
              session->callback(session->connection, ec);
          }
          else if((header_it = session->response->header.find("Transfer-Encoding")) != session->response->header.end() && header_it->second == "chunked") {
            auto chunks_streambuf = std::make_shared<asio::streambuf>(this->config.max_response_streambuf_size);
            this->read_chunked_transfer_encoded(session, chunks_streambuf);
          }
          else if(session->response->http_version < "1.1" || ((header_it = session->response->header.find("Session")) != session->response->header.end() && header_it->second == "close")) {
            session->connection->set_timeout();
            asio::async_read(*session->connection->socket, session->response->streambuf, [session](const error_code &ec, std::size_t /*bytes_transferred*/) {
              session->connection->cancel_timeout();
              auto lock = session->connection->handler_runner->continue_lock();
              if(!lock)
                return;
              if(!ec) {
                if(session->response->streambuf.size() == session->response->streambuf.max_size()) {
                  session->callback(session->connection, make_error_code::make_error_code(errc::message_size));
                  return;
                }
                session->callback(session->connection, ec);
              }
              else
                session->callback(session->connection, ec == asio::error::eof ? error_code() : ec);
            });
          }
          else
            session->callback(session->connection, ec);
        }
        else {
          if(session->connection->attempt_reconnect && ec != asio::error::operation_aborted) {
            std::unique_lock<std::mutex> lock(connections_mutex);
            auto it = connections.find(session->connection);
            if(it != connections.end()) {
              connections.erase(it);
              session->connection = create_connection();
              session->connection->attempt_reconnect = false;
              session->connection->in_use = true;
              connections.emplace(session->connection);
              lock.unlock();
              this->connect(session);
            }
            else {
              lock.unlock();
              session->callback(session->connection, ec);
            }
          }
          else
            session->callback(session->connection, ec);
        }
      });
    }